

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void av1_get_second_pass_params(AV1_COMP *cpi,EncodeFrameParams *frame_params,uint frame_flags)

{
  GF_GROUP *gf_group;
  TWO_PASS_FRAME *p_frame;
  FIRSTPASS_INFO *firstpass_info;
  int64_t *piVar1;
  int *piVar2;
  FRAME_UPDATE_TYPE FVar3;
  AV1_PRIMARY *pAVar4;
  AV1_PRIMARY *pAVar5;
  FIRSTPASS_STATS *pFVar6;
  AV1_PRIMARY *pAVar7;
  STATS_BUFFER_CTX *pSVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  FIRSTPASS_STATS *pFVar15;
  FIRSTPASS_STATS *pFVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  byte bVar20;
  int boost;
  long lVar21;
  REGIONS *regions;
  int iVar22;
  bool bVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double local_280;
  double local_220;
  double zero_motion_accumulator;
  double local_210;
  RATE_CONTROL *local_208;
  FIRSTPASS_STATS this_frame;
  FIRSTPASS_STATS this_frame_copy;
  
  pAVar4 = cpi->ppi;
  gf_group = &pAVar4->gf_group;
  if ((cpi->use_ducky_encode != 0) && ((cpi->ducky_encode_info).frame_info.gop_mode == '\x01')) {
    uVar14 = (ulong)cpi->gf_frame_index;
    frame_params->frame_type = (pAVar4->gf_group).frame_type[uVar14];
    FVar3 = (pAVar4->gf_group).update_type[uVar14];
    frame_params->show_frame = (uint)(FVar3 != '\x06' && FVar3 != '\x03');
    if (uVar14 != 0) {
      return;
    }
    av1_tf_info_reset(&pAVar4->tf_info);
    av1_tf_info_filtering(&cpi->ppi->tf_info,cpi,gf_group);
    return;
  }
  pFVar15 = (cpi->twopass_frame).stats_in;
  iVar10 = is_stat_consumption_stage(cpi);
  if (iVar10 != 0 && pFVar15 == (FIRSTPASS_STATS *)0x0) {
    return;
  }
  iVar10 = detect_app_forced_key(cpi);
  if (iVar10 == 0) {
    (cpi->rc).frames_to_key = 0;
  }
  else if ((0 < iVar10) && (iVar10 < (cpi->rc).frames_to_key)) {
    (cpi->rc).frames_to_key = iVar10;
  }
  p_frame = &cpi->twopass_frame;
  bVar20 = cpi->gf_frame_index;
  FVar3 = (pAVar4->gf_group).update_type[bVar20];
  frame_params->frame_type = (pAVar4->gf_group).frame_type[bVar20];
  if ((((frame_flags & 1) == 0) && ((int)(uint)bVar20 < (pAVar4->gf_group).size)) &&
     ((setup_target_rate(cpi), FVar3 == '\x06' || (FVar3 == '\x03')))) {
    pFVar15 = read_frame_stats(&pAVar4->twopass,p_frame,
                               (uint)(pAVar4->gf_group).arf_src_offset[cpi->gf_frame_index]);
    set_twopass_params_based_on_fp_stats(cpi,pFVar15);
    return;
  }
  if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
    (cpi->rc).active_worst_quality = (cpi->oxcf).rc_cfg.cq_level;
  }
  if (((((pAVar4->gf_group).size == (uint)cpi->gf_frame_index) && (cpi->ppi->lap_enabled != 0)) &&
      ((cpi->ppi->p_rc).enable_scenecut_detection != 0)) &&
     (iVar10 = define_kf_interval(cpi,&(pAVar4->twopass).firstpass_info,0x11,0), iVar10 != -1)) {
    iVar13 = (cpi->rc).frames_to_key;
    if (iVar13 < iVar10) {
      iVar10 = iVar13;
    }
    (cpi->rc).frames_to_key = iVar10;
  }
  memset(&this_frame,0,0xe8);
  iVar10 = is_stat_consumption_stage(cpi);
  if (iVar10 == 0) {
    (cpi->rc).active_worst_quality = (cpi->oxcf).rc_cfg.cq_level;
    bVar9 = true;
  }
  else if (((int)(uint)cpi->gf_frame_index < (pAVar4->gf_group).size) ||
          (bVar9 = true, (cpi->rc).frames_to_key == 0)) {
    process_first_pass_stats(cpi,&this_frame);
    bVar9 = false;
  }
  memcpy(&this_frame_copy,&this_frame,0xe8);
  if ((cpi->rc).frames_to_key < 1) {
    frame_params->frame_type = '\0';
    pAVar5 = cpi->ppi;
    local_280 = this_frame.coded_error;
    (cpi->rc).frames_since_key = 0;
    (pAVar5->p_rc).use_arf_in_this_kf_group =
         (uint)(byte)(2 < (cpi->oxcf).gf_cfg.lag_in_frames & (cpi->oxcf).gf_cfg.enable_auto_arf);
    memset(&pAVar5->gf_group,0,0x58f4);
    cpi->gf_frame_index = '\0';
    (cpi->rc).frames_till_gf_update_due = 0;
    if (((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) {
      iVar10 = detect_app_forced_key(cpi);
      if ((cpi->common).current_frame.frame_number == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (uint)((cpi->rc).frames_to_key == 0);
      }
      (pAVar5->p_rc).this_key_frame_forced = uVar12;
      if (iVar10 == -1) {
        iVar13 = (cpi->oxcf).kf_cfg.key_freq_max;
        iVar10 = 1;
        if (1 < iVar13) {
          iVar10 = iVar13;
        }
      }
      (cpi->rc).frames_to_key = iVar10;
      correct_frames_to_key(cpi);
      (pAVar5->p_rc).kf_boost = 0x8fc;
      (pAVar5->gf_group).update_type[0] = '\0';
    }
    else {
      firstpass_info = &(pAVar5->twopass).firstpass_info;
      pFVar6 = (cpi->twopass_frame).stats_in;
      local_220 = 0.0;
      zero_motion_accumulator = 1.0;
      (pAVar5->p_rc).this_key_frame_forced = (pAVar5->p_rc).next_key_frame_forced;
      (pAVar5->twopass).kf_group_bits = 0;
      (pAVar5->twopass).kf_group_error_left = 0.0;
      local_210 = calculate_modified_err(&cpi->frame_info,&pAVar5->twopass,&cpi->oxcf,&this_frame);
      uVar12 = 1;
      iVar11 = define_kf_interval(cpi,firstpass_info,(cpi->oxcf).kf_cfg.key_freq_max,1);
      iVar10 = (cpi->oxcf).kf_cfg.key_freq_max;
      iVar13 = iVar11;
      if (iVar10 < iVar11) {
        iVar13 = iVar10;
      }
      if (iVar11 == -1) {
        iVar13 = iVar10;
      }
      (cpi->rc).frames_to_key = iVar13;
      if (cpi->ppi->lap_enabled != 0) {
        correct_frames_to_key(cpi);
      }
      if (((cpi->oxcf).kf_cfg.auto_key == true) &&
         (iVar10 = (cpi->rc).frames_to_key, (cpi->oxcf).kf_cfg.key_freq_max < iVar10)) {
        uVar14 = (long)iVar10 / 2;
        iVar10 = (int)uVar14;
        (cpi->rc).frames_to_key = iVar10;
        (cpi->twopass_frame).stats_in = pFVar6;
        uVar18 = 0;
        pFVar16 = pFVar6;
        if (0 < iVar10) {
          uVar18 = uVar14 & 0xffffffff;
        }
        while ((iVar10 = (int)uVar18, uVar18 = (ulong)(iVar10 - 1), iVar10 != 0 &&
               (pFVar16 < ((pAVar5->twopass).stats_buf_ctx)->stats_in_end))) {
          p_frame->stats_in = pFVar16 + 1;
          pFVar16 = pFVar16 + 1;
        }
      }
      else if ((p_frame->stats_in != ((pAVar5->twopass).stats_buf_ctx)->stats_in_end) ||
              ((cpi->oxcf).pass < AOM_RC_LAST_PASS)) {
        uVar12 = (uint)((cpi->oxcf).kf_cfg.key_freq_max <= (cpi->rc).frames_to_key);
      }
      local_208 = &cpi->rc;
      piVar1 = &(pAVar5->twopass).kf_group_bits;
      (pAVar5->p_rc).next_key_frame_forced = uVar12;
      iVar10 = 0;
      dVar28 = 0.0;
      while( true ) {
        iVar13 = (cpi->rc).frames_to_key;
        if (iVar13 <= iVar10) break;
        pFVar16 = av1_firstpass_info_peek(firstpass_info,iVar10);
        if (pFVar16 != (FIRSTPASS_STATS *)0x0) {
          dVar25 = calculate_modified_err_new
                             (&cpi->frame_info,&(pAVar5->twopass).firstpass_info.total_stats,pFVar16
                              ,(cpi->oxcf).rc_cfg.vbrbias,(pAVar5->twopass).modified_error_min,
                              (pAVar5->twopass).modified_error_max);
          dVar28 = dVar28 + dVar25;
          piVar2 = &(pAVar5->p_rc).num_stats_used_for_kf_boost;
          *piVar2 = *piVar2 + 1;
        }
        iVar10 = iVar10 + 1;
      }
      if (((pAVar5->twopass).bits_left < 1) || ((pAVar5->twopass).modified_error_left <= 0.0)) {
        if (cpi->ppi->lap_enabled == 0) {
          *piVar1 = 0;
          goto LAB_001e067b;
        }
        if ((cpi->oxcf).rc_cfg.mode != AOM_Q) goto LAB_001e04eb;
        *piVar1 = 0;
        lVar17 = 0;
LAB_001e0636:
        iVar10 = (int)(cpi->framerate * 5.0);
        if (iVar10 < iVar13) {
          local_280 = (double)(long)(((double)iVar10 * (double)lVar17) / (double)iVar13);
        }
        else {
          local_280 = NAN;
        }
      }
      else {
LAB_001e04eb:
        lVar21 = (long)(cpi->rc).avg_frame_bandwidth;
        lVar17 = (cpi->oxcf).rc_cfg.vbrmax_section * lVar21;
        if (lVar17 < -99) {
          lVar19 = 0;
        }
        else {
          lVar17 = lVar17 / 100;
          lVar19 = (long)(cpi->rc).max_frame_bandwidth;
          if (lVar17 < lVar19) {
            lVar19 = lVar17;
          }
        }
        uVar12 = (cpi->oxcf).rc_cfg.vbr_corpus_complexity_lap;
        if (uVar12 == 0) {
          dVar25 = 0.0;
        }
        else {
          iVar11 = 0;
          iVar10 = 0;
          if (0 < iVar13) {
            iVar10 = iVar13;
          }
          dVar25 = 0.0;
          pFVar16 = pFVar6;
          while ((iVar22 = iVar10, iVar10 != iVar11 &&
                 (dVar25 = dVar25 + local_280, iVar22 = iVar11,
                 pFVar16 < ((pAVar5->twopass).stats_buf_ctx)->stats_in_end))) {
            local_280 = pFVar16->coded_error;
            pFVar16 = pFVar16 + 1;
            p_frame->stats_in = pFVar16;
            iVar11 = iVar11 + 1;
          }
          iVar10 = iVar22 + 1;
          if (iVar13 <= iVar22 + 1) {
            iVar10 = iVar13;
          }
          dVar25 = dVar25 / (double)iVar10;
        }
        pAVar7 = cpi->ppi;
        iVar10 = pAVar7->lap_enabled;
        if (iVar10 == 0) {
          lVar21 = (long)((dVar28 / (pAVar7->twopass).modified_error_left) *
                         (double)(pAVar7->twopass).bits_left);
        }
        else {
          lVar21 = lVar21 * iVar13;
          if (uVar12 != 0) {
            lVar21 = (long)((double)lVar21 * (dVar25 / ((double)uVar12 / 10.0)));
          }
        }
        lVar19 = lVar19 * iVar13;
        if (lVar21 < lVar19) {
          lVar19 = lVar21;
        }
        lVar17 = 0;
        if (0 < lVar19) {
          lVar17 = lVar19;
        }
        *piVar1 = lVar17;
        if (iVar10 != 0) goto LAB_001e0636;
LAB_001e067b:
        local_280 = NAN;
        iVar10 = 0x7fffffff;
      }
      (cpi->twopass_frame).stats_in = pFVar6;
      dVar26 = get_kf_boost_score(cpi,this_frame.intra_error,&zero_motion_accumulator,&local_220,0);
      dVar25 = zero_motion_accumulator;
      (cpi->twopass_frame).stats_in = pFVar6;
      (pAVar5->twopass).kf_zeromotion_pct = (int)(zero_motion_accumulator * 100.0);
      iVar13 = (cpi->rc).frames_to_key;
      uVar12 = calculate_section_intra_ratio
                         (pFVar6,((pAVar5->twopass).stats_buf_ctx)->stats_in_end,iVar13);
      (pAVar5->twopass).section_intra_rating = uVar12;
      iVar11 = (int)dVar26;
      (pAVar5->p_rc).kf_boost = iVar11;
      pAVar7 = cpi->ppi;
      if (pAVar7->lap_enabled != 0) {
        if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
          if ((pAVar7->p_rc).num_stats_used_for_kf_boost < iVar13) {
            dVar26 = (double)iVar13;
            if (dVar26 < 0.0) {
              dVar26 = sqrt(dVar26);
            }
            else {
              dVar26 = SQRT(dVar26);
            }
            if (10.0 <= dVar26) {
              dVar26 = 10.0;
            }
            if (dVar26 <= 4.0) {
              dVar26 = 4.0;
            }
            dVar27 = (double)(cpi->ppi->p_rc).num_stats_used_for_kf_boost;
            if (dVar27 < 0.0) {
              dVar27 = sqrt(dVar27);
            }
            else {
              dVar27 = SQRT(dVar27);
            }
            if (10.0 <= dVar27) {
              dVar27 = 10.0;
            }
            if (dVar27 <= 4.0) {
              dVar27 = 4.0;
            }
            dVar26 = rint(((dVar26 * 14.0 + 75.0) * (double)(cpi->ppi->p_rc).kf_boost) /
                          (dVar27 * 14.0 + 75.0));
            iVar11 = (int)dVar26;
          }
          else {
            iVar11 = (pAVar7->p_rc).kf_boost;
          }
        }
        else {
          dVar25 = get_kf_boost_score(cpi,this_frame.intra_error,&zero_motion_accumulator,&local_220
                                      ,1);
          (cpi->twopass_frame).stats_in = pFVar6;
          iVar11 = (int)dVar25 + (pAVar5->p_rc).kf_boost;
          dVar25 = zero_motion_accumulator;
        }
      }
      iVar13 = (cpi->rc).frames_to_key;
      if (iVar13 < 9 || dVar25 <= 0.99) {
        iVar22 = iVar13 * 3;
        if (iVar11 != iVar22 && SBORROW4(iVar11,iVar22) == iVar11 + iVar13 * -3 < 0) {
          iVar22 = iVar11;
        }
        boost = 600;
        if (600 < iVar22) {
          boost = iVar22;
        }
      }
      else {
        boost = 0x1518;
        if (0x1518 < iVar11) {
          boost = iVar11;
        }
      }
      (pAVar5->p_rc).kf_boost = boost;
      if (iVar13 < iVar10) {
        iVar10 = iVar13;
      }
      lVar17 = (pAVar5->twopass).kf_group_bits;
      if (lVar17 < (long)local_280) {
        local_280 = (double)lVar17;
      }
      iVar10 = calculate_boost_bits(iVar10 + -1,boost,(int64_t)local_280);
      iVar10 = adjust_boost_bits_for_target_level(cpi,local_208,iVar10,lVar17,0);
      piVar1 = &(pAVar5->twopass).kf_group_bits;
      *piVar1 = *piVar1 - (long)iVar10;
      (pAVar5->gf_group).bit_allocation[0] = iVar10;
      (pAVar5->gf_group).update_type[0] = '\0';
      if (cpi->ppi->lap_enabled == 0) {
        dVar25 = dVar28 - local_210;
      }
      else {
        dVar25 = (double)((cpi->rc).frames_to_key + -1);
      }
      (pAVar5->twopass).kf_group_error_left = dVar25;
      (pAVar5->twopass).modified_error_left = (pAVar5->twopass).modified_error_left - dVar28;
    }
    memcpy(&this_frame,&this_frame_copy,0xe8);
  }
  if ((cpi->rc).frames_to_fwd_kf < 1) {
    (cpi->rc).frames_to_fwd_kf = (cpi->oxcf).kf_cfg.fwd_kf_dist;
  }
  bVar20 = cpi->gf_frame_index;
  if ((pAVar4->gf_group).size != (uint)bVar20) goto LAB_001e0e25;
  av1_tf_info_reset(&cpi->ppi->tf_info);
  iVar10 = (cpi->oxcf).gf_cfg.lag_in_frames;
  if (iVar10 < 0x20) {
    iVar13 = 0x10;
  }
  else {
    iVar11 = (cpi->oxcf).algo_cfg.arnr_max_frames / -2 + iVar10;
    iVar13 = 0x20;
    if (iVar11 < 0x20) {
      iVar13 = iVar11;
    }
  }
  if ((0 < (cpi->oxcf).kf_cfg.fwd_kf_dist) &&
     (iVar11 = (cpi->rc).frames_to_fwd_kf + 1, iVar11 < iVar13)) {
    iVar13 = iVar11;
  }
  if (iVar10 == 0) {
    iVar13 = (cpi->rc).max_gf_interval;
  }
  iVar10 = (cpi->rc).frames_to_key;
  uVar12 = (cpi->rc).frames_since_key;
  if (iVar10 <= iVar13) {
    iVar13 = iVar10;
  }
  if ((uVar12 < 2) ||
     ((iVar11 = (pAVar4->p_rc).frames_till_regions_update - uVar12, iVar11 < iVar10 &&
      (iVar11 <= iVar13)))) {
    pSVar8 = (pAVar4->twopass).stats_buf_ctx;
    pFVar6 = pSVar8->stats_in_end;
    pFVar16 = (cpi->twopass_frame).stats_in;
    iVar11 = (int)(((long)pFVar6 - (long)pFVar16) / 0xe8) + (uint)(uVar12 == 0);
    if (iVar10 < iVar11) {
      iVar11 = iVar10;
    }
    if (0x95 < iVar11) {
      iVar11 = 0x96;
    }
    (pAVar4->p_rc).frames_till_regions_update = iVar11;
    if (cpi->ppi->lap_enabled == 0) {
      pFVar16 = pFVar16 + -(ulong)(uVar12 == 0);
      uVar12 = 0;
    }
    else {
      mark_flashes(pSVar8->stats_in_start,pFVar6);
      pSVar8 = (pAVar4->twopass).stats_buf_ctx;
      estimate_noise(pSVar8->stats_in_start,pSVar8->stats_in_end,(cpi->common).error);
      pSVar8 = (pAVar4->twopass).stats_buf_ctx;
      estimate_coeff(pSVar8->stats_in_start,pSVar8->stats_in_end);
      pFVar16 = (cpi->twopass_frame).stats_in;
      uVar12 = (uint)((cpi->rc).frames_since_key == 0);
    }
    iVar10 = identify_regions(pFVar16,iVar11,uVar12,(pAVar4->p_rc).regions,
                              &(pAVar4->p_rc).num_regions);
    if (iVar10 == -1) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Error allocating buffers in identify_regions");
    }
  }
  regions = (pAVar4->p_rc).regions;
  iVar10 = (cpi->rc).frames_since_key;
  uVar12 = find_regions_index(regions,(pAVar4->p_rc).num_regions,
                              iVar10 - (pAVar4->p_rc).regions_offset);
  if ((int)uVar12 < 0) {
    if (iVar10 == 0) goto LAB_001e0b3f;
  }
  else if ((iVar10 == 0) || ((pAVar4->p_rc).regions[uVar12].type == SCENECUT_REGION)) {
LAB_001e0b3f:
    (cpi->ppi->gf_state).arf_gf_boost_lst = 0;
  }
  calculate_gf_length(cpi,iVar13,0xf);
  if ((((0x10 < iVar13) && ((cpi->oxcf).algo_cfg.enable_tpl_model == true)) &&
      (0x1f < (cpi->oxcf).gf_cfg.lag_in_frames)) &&
     ((cpi->sf).tpl_sf.gop_length_decision_method != 3)) {
    iVar10 = (pAVar4->p_rc).gf_intervals[(pAVar4->p_rc).cur_gf_index];
    iVar22 = ((cpi->rc).frames_since_key + iVar10) - (pAVar4->p_rc).regions_offset;
    iVar13 = (pAVar4->p_rc).num_regions;
    iVar11 = find_regions_index(regions,iVar13,iVar22 + -1);
    iVar13 = find_regions_index(regions,iVar13,iVar22);
    bVar23 = true;
    if ((iVar10 < (cpi->rc).frames_to_key) &&
       ((iVar11 == -1 || ((pAVar4->p_rc).regions[iVar11].type != SCENECUT_REGION)))) {
      if (iVar13 == -1) {
        bVar23 = false;
      }
      else {
        bVar23 = (pAVar4->p_rc).regions[iVar13].type == SCENECUT_REGION;
      }
    }
    if ((0x10 < iVar10) && ((cpi->rc).min_gf_interval < 0x11)) {
      define_gf_group(cpi,frame_params,0);
      av1_tf_info_filtering(&cpi->ppi->tf_info,cpi,gf_group);
      memcpy(&this_frame,&this_frame_copy,0xe8);
      pAVar5 = cpi->ppi;
      iVar13 = (cpi->sf).tpl_sf.gop_length_decision_method;
      av1_tpl_preload_rc_estimate(cpi,frame_params);
      if (iVar13 == 2) {
        if (((double)((pAVar5->p_rc).num_stats_used_for_gfu_boost * 0x32) * 1.4 <=
             (double)(pAVar5->p_rc).gfu_boost) ||
           (iVar13 = av1_tpl_setup_stats(cpi,3,frame_params), iVar13 != 0)) goto LAB_001e0db0;
      }
      else {
        if ((cpi->rc).frames_since_key < 1) {
          bVar20 = 1;
        }
        else {
          bVar20 = (byte)((uint)(cpi->ppi->gf_group).arf_index >> 0x1f);
        }
        if (iVar13 == 1) {
          iVar13 = av1_tpl_setup_stats(cpi,2,frame_params);
          bVar24 = iVar13 == 0;
          if (iVar13 == 2) goto LAB_001e0d4c;
        }
        else {
LAB_001e0d4c:
          iVar13 = av1_tpl_setup_stats(cpi,1,frame_params);
          bVar24 = iVar13 == 0;
          if (bVar20 == 0 && !bVar24) {
            cpi->skip_tpl_setup_stats = 1;
            goto LAB_001e0db0;
          }
        }
        if (!bVar24) goto LAB_001e0db0;
      }
      calculate_gf_length(cpi,0x10,1);
      if ((bVar23) &&
         (iVar13 = (pAVar4->p_rc).cur_gf_index, iVar10 - (pAVar4->p_rc).gf_intervals[iVar13] < 4)) {
        (pAVar4->p_rc).gf_intervals[iVar13] = iVar10;
      }
    }
  }
LAB_001e0db0:
  define_gf_group(cpi,frame_params,0);
  if ((gf_group->update_type[cpi->gf_frame_index] != '\x03') && (0 < (cpi->rc).frames_since_key)) {
    process_first_pass_stats(cpi,&this_frame);
  }
  define_gf_group(cpi,frame_params,1);
  av1_tf_info_filtering(&cpi->ppi->tf_info,cpi,gf_group);
  (cpi->rc).frames_till_gf_update_due = (pAVar4->p_rc).baseline_gf_interval;
  bVar20 = cpi->gf_frame_index;
LAB_001e0e25:
  uVar14 = (ulong)bVar20;
  if ((gf_group->update_type[uVar14] == '\x06') || (gf_group->update_type[uVar14] == '\x03')) {
    (cpi->twopass_frame).stats_in = pFVar15;
    pFVar15 = read_frame_stats(&pAVar4->twopass,p_frame,
                               (uint)(pAVar4->gf_group).arf_src_offset[uVar14]);
    set_twopass_params_based_on_fp_stats(cpi,pFVar15);
    uVar14 = (ulong)cpi->gf_frame_index;
  }
  else {
    if (bVar9) {
      pFVar15 = (FIRSTPASS_STATS *)0x0;
    }
    (cpi->twopass_frame).this_frame = pFVar15;
  }
  frame_params->frame_type = (pAVar4->gf_group).frame_type[uVar14];
  setup_target_rate(cpi);
  return;
}

Assistant:

void av1_get_second_pass_params(AV1_COMP *cpi,
                                EncodeFrameParams *const frame_params,
                                unsigned int frame_flags) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  if (cpi->use_ducky_encode &&
      cpi->ducky_encode_info.frame_info.gop_mode == DUCKY_ENCODE_GOP_MODE_RCL) {
    frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];
    frame_params->show_frame =
        !(gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
          gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE);
    if (cpi->gf_frame_index == 0) {
      av1_tf_info_reset(&cpi->ppi->tf_info);
      av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);
    }
    return;
  }

  const FIRSTPASS_STATS *const start_pos = cpi->twopass_frame.stats_in;
  int update_total_stats = 0;

  if (is_stat_consumption_stage(cpi) && !cpi->twopass_frame.stats_in) return;

  // Check forced key frames.
  const int frames_to_next_forced_key = detect_app_forced_key(cpi);
  if (frames_to_next_forced_key == 0) {
    rc->frames_to_key = 0;
    frame_flags &= FRAMEFLAGS_KEY;
  } else if (frames_to_next_forced_key > 0 &&
             frames_to_next_forced_key < rc->frames_to_key) {
    rc->frames_to_key = frames_to_next_forced_key;
  }

  assert(cpi->twopass_frame.stats_in != NULL);
  const int update_type = gf_group->update_type[cpi->gf_frame_index];
  frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];

  if (cpi->gf_frame_index < gf_group->size && !(frame_flags & FRAMEFLAGS_KEY)) {
    assert(cpi->gf_frame_index < gf_group->size);

    setup_target_rate(cpi);

    // If this is an arf frame then we dont want to read the stats file or
    // advance the input pointer as we already have what we need.
    if (update_type == ARF_UPDATE || update_type == INTNL_ARF_UPDATE) {
      const FIRSTPASS_STATS *const this_frame_ptr =
          read_frame_stats(twopass, &cpi->twopass_frame,
                           gf_group->arf_src_offset[cpi->gf_frame_index]);
      set_twopass_params_based_on_fp_stats(cpi, this_frame_ptr);
      return;
    }
  }

  if (oxcf->rc_cfg.mode == AOM_Q)
    rc->active_worst_quality = oxcf->rc_cfg.cq_level;

  if (cpi->gf_frame_index == gf_group->size) {
    if (cpi->ppi->lap_enabled && cpi->ppi->p_rc.enable_scenecut_detection) {
      const int num_frames_to_detect_scenecut = MAX_GF_LENGTH_LAP + 1;
      const int frames_to_key = define_kf_interval(
          cpi, &twopass->firstpass_info, num_frames_to_detect_scenecut,
          /*search_start_idx=*/0);
      if (frames_to_key != -1)
        rc->frames_to_key = AOMMIN(rc->frames_to_key, frames_to_key);
    }
  }

  FIRSTPASS_STATS this_frame;
  av1_zero(this_frame);
  // call above fn
  if (is_stat_consumption_stage(cpi)) {
    if (cpi->gf_frame_index < gf_group->size || rc->frames_to_key == 0) {
      process_first_pass_stats(cpi, &this_frame);
      update_total_stats = 1;
    }
  } else {
    rc->active_worst_quality = oxcf->rc_cfg.cq_level;
  }

  // Keyframe and section processing.
  FIRSTPASS_STATS this_frame_copy;
  this_frame_copy = this_frame;
  if (rc->frames_to_key <= 0) {
    assert(rc->frames_to_key == 0);
    // Define next KF group and assign bits to it.
    frame_params->frame_type = KEY_FRAME;
    find_next_key_frame(cpi, &this_frame);
    this_frame = this_frame_copy;
  }

  if (rc->frames_to_fwd_kf <= 0)
    rc->frames_to_fwd_kf = oxcf->kf_cfg.fwd_kf_dist;

  // Define a new GF/ARF group. (Should always enter here for key frames).
  if (cpi->gf_frame_index == gf_group->size) {
    av1_tf_info_reset(&cpi->ppi->tf_info);
#if CONFIG_BITRATE_ACCURACY && !CONFIG_THREE_PASS
    vbr_rc_reset_gop_data(&cpi->vbr_rc_info);
#endif  // CONFIG_BITRATE_ACCURACY
    int max_gop_length =
        (oxcf->gf_cfg.lag_in_frames >= 32)
            ? AOMMIN(MAX_GF_INTERVAL, oxcf->gf_cfg.lag_in_frames -
                                          oxcf->algo_cfg.arnr_max_frames / 2)
            : MAX_GF_LENGTH_LAP;

    // Handle forward key frame when enabled.
    if (oxcf->kf_cfg.fwd_kf_dist > 0)
      max_gop_length = AOMMIN(rc->frames_to_fwd_kf + 1, max_gop_length);

    // Use the provided gop size in low delay setting
    if (oxcf->gf_cfg.lag_in_frames == 0) max_gop_length = rc->max_gf_interval;

    // Limit the max gop length for the last gop in 1 pass setting.
    max_gop_length = AOMMIN(max_gop_length, rc->frames_to_key);

    // Identify regions if needed.
    // TODO(bohanli): identify regions for all stats available.
    if (rc->frames_since_key == 0 || rc->frames_since_key == 1 ||
        (p_rc->frames_till_regions_update - rc->frames_since_key <
             rc->frames_to_key &&
         p_rc->frames_till_regions_update - rc->frames_since_key <
             max_gop_length + 1)) {
      // how many frames we can analyze from this frame
      int rest_frames =
          AOMMIN(rc->frames_to_key, MAX_FIRSTPASS_ANALYSIS_FRAMES);
      rest_frames =
          AOMMIN(rest_frames, (int)(twopass->stats_buf_ctx->stats_in_end -
                                    cpi->twopass_frame.stats_in +
                                    (rc->frames_since_key == 0)));
      p_rc->frames_till_regions_update = rest_frames;

      int ret;
      if (cpi->ppi->lap_enabled) {
        mark_flashes(twopass->stats_buf_ctx->stats_in_start,
                     twopass->stats_buf_ctx->stats_in_end);
        estimate_noise(twopass->stats_buf_ctx->stats_in_start,
                       twopass->stats_buf_ctx->stats_in_end, cpi->common.error);
        estimate_coeff(twopass->stats_buf_ctx->stats_in_start,
                       twopass->stats_buf_ctx->stats_in_end);
        ret = identify_regions(cpi->twopass_frame.stats_in, rest_frames,
                               (rc->frames_since_key == 0), p_rc->regions,
                               &p_rc->num_regions);
      } else {
        ret = identify_regions(
            cpi->twopass_frame.stats_in - (rc->frames_since_key == 0),
            rest_frames, 0, p_rc->regions, &p_rc->num_regions);
      }
      if (ret == -1) {
        aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                           "Error allocating buffers in identify_regions");
      }
    }

    int cur_region_idx =
        find_regions_index(p_rc->regions, p_rc->num_regions,
                           rc->frames_since_key - p_rc->regions_offset);
    if ((cur_region_idx >= 0 &&
         p_rc->regions[cur_region_idx].type == SCENECUT_REGION) ||
        rc->frames_since_key == 0) {
      // If we start from a scenecut, then the last GOP's arf boost is not
      // needed for this GOP.
      cpi->ppi->gf_state.arf_gf_boost_lst = 0;
    }

    int need_gf_len = 1;
#if CONFIG_THREE_PASS
    if (cpi->third_pass_ctx && oxcf->pass == AOM_RC_THIRD_PASS) {
      // set up bitstream to read
      if (!cpi->third_pass_ctx->input_file_name && oxcf->two_pass_output) {
        cpi->third_pass_ctx->input_file_name = oxcf->two_pass_output;
      }
      av1_open_second_pass_log(cpi, 1);
      THIRD_PASS_GOP_INFO *gop_info = &cpi->third_pass_ctx->gop_info;
      // Read in GOP information from the second pass file.
      av1_read_second_pass_gop_info(cpi->second_pass_log_stream, gop_info,
                                    cpi->common.error);
#if CONFIG_BITRATE_ACCURACY
      TPL_INFO *tpl_info;
      AOM_CHECK_MEM_ERROR(cpi->common.error, tpl_info,
                          aom_malloc(sizeof(*tpl_info)));
      av1_read_tpl_info(tpl_info, cpi->second_pass_log_stream,
                        cpi->common.error);
      aom_free(tpl_info);
#if CONFIG_THREE_PASS
      // TODO(angiebird): Put this part into a func
      cpi->vbr_rc_info.cur_gop_idx++;
#endif  // CONFIG_THREE_PASS
#endif  // CONFIG_BITRATE_ACCURACY
      // Read in third_pass_info from the bitstream.
      av1_set_gop_third_pass(cpi->third_pass_ctx);
      // Read in per-frame info from second-pass encoding
      av1_read_second_pass_per_frame_info(
          cpi->second_pass_log_stream, cpi->third_pass_ctx->frame_info,
          gop_info->num_frames, cpi->common.error);

      p_rc->cur_gf_index = 0;
      p_rc->gf_intervals[0] = cpi->third_pass_ctx->gop_info.gf_length;
      need_gf_len = 0;
    }
#endif  // CONFIG_THREE_PASS

    if (need_gf_len) {
      // If we cannot obtain GF group length from second_pass_file
      // TODO(jingning): Resolve the redundant calls here.
      if (rc->intervals_till_gf_calculate_due == 0 || 1) {
        calculate_gf_length(cpi, max_gop_length, MAX_NUM_GF_INTERVALS);
      }

      if (max_gop_length > 16 && oxcf->algo_cfg.enable_tpl_model &&
          oxcf->gf_cfg.lag_in_frames >= 32 &&
          cpi->sf.tpl_sf.gop_length_decision_method != 3) {
        int this_idx = rc->frames_since_key +
                       p_rc->gf_intervals[p_rc->cur_gf_index] -
                       p_rc->regions_offset - 1;
        int this_region =
            find_regions_index(p_rc->regions, p_rc->num_regions, this_idx);
        int next_region =
            find_regions_index(p_rc->regions, p_rc->num_regions, this_idx + 1);
        // TODO(angiebird): Figure out why this_region and next_region are -1 in
        // unit test like AltRefFramePresenceTestLarge (aomedia:3134)
        int is_last_scenecut =
            p_rc->gf_intervals[p_rc->cur_gf_index] >= rc->frames_to_key ||
            (this_region != -1 &&
             p_rc->regions[this_region].type == SCENECUT_REGION) ||
            (next_region != -1 &&
             p_rc->regions[next_region].type == SCENECUT_REGION);

        int ori_gf_int = p_rc->gf_intervals[p_rc->cur_gf_index];

        if (p_rc->gf_intervals[p_rc->cur_gf_index] > 16 &&
            rc->min_gf_interval <= 16) {
          // The calculate_gf_length function is previously used with
          // max_gop_length = 32 with look-ahead gf intervals.
          define_gf_group(cpi, frame_params, 0);
          av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);
          this_frame = this_frame_copy;

          if (is_shorter_gf_interval_better(cpi, frame_params)) {
            // A shorter gf interval is better.
            // TODO(jingning): Remove redundant computations here.
            max_gop_length = 16;
            calculate_gf_length(cpi, max_gop_length, 1);
            if (is_last_scenecut &&
                (ori_gf_int - p_rc->gf_intervals[p_rc->cur_gf_index] < 4)) {
              p_rc->gf_intervals[p_rc->cur_gf_index] = ori_gf_int;
            }
          }
        }
      }
    }

    define_gf_group(cpi, frame_params, 0);

    if (gf_group->update_type[cpi->gf_frame_index] != ARF_UPDATE &&
        rc->frames_since_key > 0)
      process_first_pass_stats(cpi, &this_frame);

    define_gf_group(cpi, frame_params, 1);

#if CONFIG_THREE_PASS
    // write gop info if needed for third pass. Per-frame info is written after
    // each frame is encoded.
    av1_write_second_pass_gop_info(cpi);
#endif  // CONFIG_THREE_PASS

    av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);

    rc->frames_till_gf_update_due = p_rc->baseline_gf_interval;
    assert(cpi->gf_frame_index == 0);
#if ARF_STATS_OUTPUT
    {
      FILE *fpfile;
      fpfile = fopen("arf.stt", "a");
      ++arf_count;
      fprintf(fpfile, "%10d %10d %10d %10d %10d\n",
              cpi->common.current_frame.frame_number,
              rc->frames_till_gf_update_due, cpi->ppi->p_rc.kf_boost, arf_count,
              p_rc->gfu_boost);

      fclose(fpfile);
    }
#endif
  }
  assert(cpi->gf_frame_index < gf_group->size);

  if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
      gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE) {
    reset_fpf_position(&cpi->twopass_frame, start_pos);

    const FIRSTPASS_STATS *const this_frame_ptr =
        read_frame_stats(twopass, &cpi->twopass_frame,
                         gf_group->arf_src_offset[cpi->gf_frame_index]);
    set_twopass_params_based_on_fp_stats(cpi, this_frame_ptr);
  } else {
    // Back up this frame's stats for updating total stats during post encode.
    cpi->twopass_frame.this_frame = update_total_stats ? start_pos : NULL;
  }

  frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];
  setup_target_rate(cpi);
}